

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O2

void __thiscall Rml::DataModel::OnElementRemove(DataModel *this,Element *element)

{
  Element *local_20;
  
  local_20 = element;
  EraseAliases(this,element);
  DataViews::OnElementRemove
            ((this->views)._M_t.
             super___uniq_ptr_impl<Rml::DataViews,_std::default_delete<Rml::DataViews>_>._M_t.
             super__Tuple_impl<0UL,_Rml::DataViews_*,_std::default_delete<Rml::DataViews>_>.
             super__Head_base<0UL,_Rml::DataViews_*,_false>._M_head_impl,element);
  DataControllers::OnElementRemove
            ((this->controllers)._M_t.
             super___uniq_ptr_impl<Rml::DataControllers,_std::default_delete<Rml::DataControllers>_>
             ._M_t.
             super__Tuple_impl<0UL,_Rml::DataControllers_*,_std::default_delete<Rml::DataControllers>_>
             .super__Head_base<0UL,_Rml::DataControllers_*,_false>._M_head_impl,element);
  itlib::
  flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
  ::erase<Rml::Element*>
            ((flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
              *)&this->attached_elements,&local_20);
  return;
}

Assistant:

void DataModel::OnElementRemove(Element* element)
{
	EraseAliases(element);
	views->OnElementRemove(element);
	controllers->OnElementRemove(element);
	attached_elements.erase(element);
}